

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O1

void __thiscall
soul::RewritingASTVisitor::replaceAs<soul::AST::VariableDeclaration>
          (RewritingASTVisitor *this,pool_ptr<soul::AST::VariableDeclaration> *o)

{
  VariableDeclaration *local_20;
  
  visitAs<soul::AST::VariableDeclaration>
            ((RewritingASTVisitor *)&local_20,(pool_ptr<soul::AST::VariableDeclaration> *)this);
  if (o->object != local_20) {
    this->itemsReplaced = this->itemsReplaced + 1;
    o->object = local_20;
  }
  return;
}

Assistant:

void replaceAs (pool_ref<Type>& o)   { replace (o, visitAs<Type> (o)); }